

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

void __thiscall Circuit::output_gate(Circuit *this,ostream *s,uint i)

{
  const_reference pvVar1;
  ostream *poVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  uint in_EDX;
  ostream *in_RSI;
  long in_RDI;
  uint j_1;
  uint j;
  uint local_1c;
  uint local_18;
  
  pvVar1 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                     ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),(ulong)in_EDX);
  if (*pvVar1 == INV) {
    poVar2 = std::operator<<(in_RSI,"1 1 ");
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RDI + 0x50),(ulong)in_EDX);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
    poVar2 = std::operator<<(poVar2," ");
    pvVar3 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)(in_RDI + 0x68),(ulong)in_EDX);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
    std::operator<<(poVar2," INV");
  }
  else {
    pvVar1 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),(ulong)in_EDX
                       );
    if (*pvVar1 == EQ) {
      poVar2 = std::operator<<(in_RSI,"1 1 ");
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 0x50),(ulong)in_EDX);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
      poVar2 = std::operator<<(poVar2," ");
      pvVar3 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 0x68),(ulong)in_EDX);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
      std::operator<<(poVar2," EQ");
    }
    else {
      pvVar1 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                         ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),
                          (ulong)in_EDX);
      if (*pvVar1 == EQW) {
        poVar2 = std::operator<<(in_RSI,"1 1 ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RDI + 0x50),(ulong)in_EDX);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
        poVar2 = std::operator<<(poVar2," ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RDI + 0x68),(ulong)in_EDX);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar3,0);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
        std::operator<<(poVar2," EQW");
      }
      else {
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RDI + 0x50),(ulong)in_EDX);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        poVar2 = (ostream *)std::ostream::operator<<(in_RSI,sVar5);
        poVar2 = std::operator<<(poVar2," ");
        pvVar3 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RDI + 0x68),(ulong)in_EDX);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
        std::operator<<(poVar2," ");
        local_18 = 0;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)(in_RDI + 0x50),(ulong)in_EDX);
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
          if (sVar5 <= local_18) break;
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)(in_RDI + 0x50),(ulong)in_EDX);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvVar3,(ulong)local_18);
          poVar2 = (ostream *)std::ostream::operator<<(in_RSI,*pvVar4);
          std::operator<<(poVar2," ");
          local_18 = local_18 + 1;
        }
        local_1c = 0;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)(in_RDI + 0x68),(ulong)in_EDX);
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar3);
          if (sVar5 <= local_1c) break;
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 *)(in_RDI + 0x68),(ulong)in_EDX);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvVar3,(ulong)local_1c);
          poVar2 = (ostream *)std::ostream::operator<<(in_RSI,*pvVar4);
          std::operator<<(poVar2," ");
          local_1c = local_1c + 1;
        }
        pvVar1 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                           ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),
                            (ulong)in_EDX);
        if (*pvVar1 == AND) {
          std::operator<<(in_RSI,"AND");
        }
        else {
          pvVar1 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                             ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),
                              (ulong)in_EDX);
          if (*pvVar1 == MAND) {
            std::operator<<(in_RSI,"MAND");
          }
          else {
            std::operator<<(in_RSI,"XOR");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Circuit::output_gate(ostream &s, unsigned int i) const {
  if (GateT[i] == INV) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " INV";
  } else if (GateT[i] == EQ) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQ";
  } else if (GateT[i] == EQW) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQW";
  } else {
    s << GateI[i].size() << " " << GateO[i].size() << " ";
    for (unsigned int j = 0; j < GateI[i].size(); j++) {
      s << GateI[i][j] << " ";
    }
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      s << GateO[i][j] << " ";
    }
    if (GateT[i] == AND) {
      s << "AND";
    } else if (GateT[i] == MAND) {
      s << "MAND";
    } else {
      s << "XOR";
    }
  }
}